

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int xar_finish_entry(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  ssize_t sVar3;
  _func_int_archive_md5_ctx_ptr_void_ptr **pp_Var4;
  ulong uVar5;
  ulong s;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  
  pvVar1 = a->format_data;
  lVar7 = *(long *)((long)pvVar1 + 0x40);
  if (lVar7 == 0) {
    return 0;
  }
  uVar5 = *(ulong *)((long)pvVar1 + 0x48);
  if (uVar5 != 0) {
    do {
      s = a->null_length;
      if (uVar5 < a->null_length) {
        s = uVar5;
      }
      sVar3 = xar_write_data(a,a->nulls,s);
      if (sVar3 < 1) {
        return (int)sVar3;
      }
      uVar5 = *(long *)((long)pvVar1 + 0x48) - sVar3;
      *(ulong *)((long)pvVar1 + 0x48) = uVar5;
    } while (uVar5 != 0);
    lVar7 = *(long *)((long)pvVar1 + 0x40);
  }
  iVar2 = *(int *)((long)pvVar1 + 0xb0);
  if (iVar2 == 0) {
    uVar8 = 0;
LAB_00281de4:
    *(undefined8 *)(lVar7 + 0x130) = uVar8;
  }
  else {
    if (iVar2 == 1) {
      pp_Var4 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
      uVar8 = 0x14;
      lVar6 = 0x10;
LAB_00281dc8:
      (**pp_Var4)((archive_md5_ctx *)(lVar6 + (long)pvVar1 + 0xb0),(void *)(lVar7 + 0x138));
      iVar2 = *(int *)((long)pvVar1 + 0xb0);
      goto LAB_00281de4;
    }
    if (iVar2 == 2) {
      pp_Var4 = &__archive_digest.md5final;
      uVar8 = 0x10;
      lVar6 = 8;
      goto LAB_00281dc8;
    }
  }
  *(int *)(lVar7 + 0x128) = iVar2;
  iVar2 = *(int *)((long)pvVar1 + 0x98);
  if (iVar2 == 0) {
    uVar8 = 0;
  }
  else {
    if (iVar2 == 1) {
      pp_Var4 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
      uVar8 = 0x14;
      lVar6 = 0x10;
    }
    else {
      if (iVar2 != 2) goto LAB_00281e4f;
      pp_Var4 = &__archive_digest.md5final;
      uVar8 = 0x10;
      lVar6 = 8;
    }
    (**pp_Var4)((archive_md5_ctx *)(lVar6 + (long)pvVar1 + 0x98),(void *)(lVar7 + 0x110));
    iVar2 = *(int *)((long)pvVar1 + 0x98);
  }
  *(undefined8 *)(lVar7 + 0x108) = uVar8;
LAB_00281e4f:
  *(int *)(lVar7 + 0x100) = iVar2;
  *(undefined8 *)((long)pvVar1 + 0x40) = 0;
  return 0;
}

Assistant:

static int
xar_finish_entry(struct archive_write *a)
{
	struct xar *xar;
	struct file *file;
	size_t s;
	ssize_t w;

	xar = (struct xar *)a->format_data;
	if (xar->cur_file == NULL)
		return (ARCHIVE_OK);

	while (xar->bytes_remaining > 0) {
		s = (size_t)xar->bytes_remaining;
		if (s > a->null_length)
			s = a->null_length;
		w = xar_write_data(a, a->nulls, s);
		if (w > 0)
			xar->bytes_remaining -= w;
		else
			return ((int)w);
	}
	file = xar->cur_file;
	checksum_final(&(xar->e_sumwrk), &(file->data.e_sum));
	checksum_final(&(xar->a_sumwrk), &(file->data.a_sum));
	xar->cur_file = NULL;

	return (ARCHIVE_OK);
}